

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O0

void __thiscall mwheel::DLManager::load_library(DLManager *this,path *library_path)

{
  value_type *pvVar1;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar2;
  undefined8 uVar3;
  stringstream estream;
  char *error_message;
  void *handle;
  string *in_stack_fffffffffffffd98;
  error_loading_dynamic_library *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
  *in_stack_fffffffffffffdb0;
  path *in_stack_fffffffffffffdf8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  char *local_20;
  undefined8 local_18;
  
  pvVar1 = boost::filesystem::path::c_str((path *)0x10f3e1);
  local_18 = dlopen(pvVar1,1);
  local_20 = (char *)dlerror();
  if (local_20 != (char *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"ERROR : cannot load shared library ");
    this_00 = boost::filesystem::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_198,"\t");
    poVar2 = std::operator<<(poVar2,local_20);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    error_loading_dynamic_library::error_loading_dynamic_library
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    __cxa_throw(uVar3,&error_loading_dynamic_library::typeinfo,
                error_loading_dynamic_library::~error_loading_dynamic_library);
  }
  std::make_pair<boost::filesystem::path_const&,void*&>
            ((path *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (void **)&stack0xfffffffffffffdf8);
  std::
  map<boost::filesystem::path,void*,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
  ::insert<std::pair<boost::filesystem::path,void*>>
            (in_stack_fffffffffffffdb0,
             (pair<boost::filesystem::path,_void_*> *)
             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  std::pair<boost::filesystem::path,_void_*>::~pair
            ((pair<boost::filesystem::path,_void_*> *)0x10f5dd);
  return;
}

Assistant:

void DLManager::load_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto handle = dlopen(library_path.c_str(), RTLD_LAZY);
  auto error_message = dlerror();
  if (error_message) {
    stringstream estream;
    estream << "ERROR : cannot load shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_loading_dynamic_library(estream.str());
  }
  m_dl_map.insert(make_pair(library_path, handle));
#endif
}